

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>(WasmBytecodeGenerator *this)

{
  ArenaAllocator *this_00;
  TypedRegisterAllocator *this_01;
  Type TVar1;
  Type TVar2;
  IWasmByteCodeWriter *pIVar3;
  code *pcVar4;
  anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1 aVar5;
  bool bVar6;
  ArgSlot AVar7;
  uint16 uVar8;
  ArgSlot AVar9;
  BOOL BVar10;
  Local LVar11;
  uint uVar12;
  uint uVar13;
  RegSlot RVar14;
  RegSlot RVar15;
  uint32 uVar16;
  EmitInfoBase EVar17;
  AsmJsRetType AVar18;
  undefined4 *puVar19;
  EmitInfo EVar20;
  WasmBinaryReader *pWVar21;
  WasmSignature *this_02;
  EmitInfo EVar22;
  RegisterSpace *pRVar23;
  WasmRegisterSpace *pWVar24;
  WasmCompilationException *this_03;
  undefined4 uVar25;
  undefined8 in_RCX;
  EmitInfo *pEVar26;
  ushort uVar27;
  long lVar28;
  ulong uVar29;
  WasmType WVar30;
  ulong uVar31;
  ulong count;
  ulong uVar32;
  PolymorphicEmitInfo PVar33;
  EmitInfo local_a0;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  undefined1 local_88 [8];
  PolymorphicEmitInfo retInfo;
  EmitInfo *local_48;
  ushort local_38;
  anon_class_1_0_00000001 local_35;
  RegSlot local_34;
  ArgSlot args;
  anon_class_1_0_00000001 argOverflow;
  
  pWVar21 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar21 == (WasmBinaryReader *)0x0) {
    pWVar21 = (this->m_module->m_reader).ptr;
  }
  TVar1 = (pWVar21->super_WasmReaderBase).m_currentNode.field_1.call.funcType;
  if (TVar1 == Function) {
LAB_00f238cd:
    local_34 = 0;
  }
  else {
    local_34 = (RegSlot)CONCAT71((int7)((ulong)in_RCX >> 8),1);
    if (TVar1 != Import) {
      if (TVar1 != ImportThunk) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar19 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                           ,0x449,
                           "(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk)"
                           ,
                           "isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk"
                          );
        if (!bVar6) goto LAB_00f241f6;
        *puVar19 = 0;
      }
      goto LAB_00f238cd;
    }
  }
  EVar20 = PopEvalStack(this,FirstLocalType,L"Indirect call index must be int type");
  pWVar21 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar21 == (WasmBinaryReader *)0x0) {
    pWVar21 = (this->m_module->m_reader).ptr;
  }
  local_a0 = EVar20;
  this_02 = Js::WebAssemblyModule::GetSignature
                      (this->m_module,
                       (pWVar21->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets);
  if ((char)local_34 == '\0') {
    uVar8 = WasmSignature::GetParamsSize(this_02);
    uVar27 = 0x1c;
  }
  else {
    AVar7 = WasmSignature::GetParamCount(this_02);
    uVar8 = UInt16Math::
            Mul<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>()::_lambda()_1_const>
                      (AVar7,8,&local_35);
    uVar27 = 0x11;
  }
  uVar8 = UInt16Math::
          Add<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>()::_lambda()_1_const>
                    (uVar8,8,&local_35);
  if ((uVar8 & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar19 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x478,"((0))","Wasm argument size should always be Var aligned");
    if (!bVar6) {
LAB_00f241f6:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar19 = 0;
    this_03 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(this_03,L"Internal Error");
    goto LAB_00f241e0;
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1f])(this->m_writer,(ulong)uVar27,(ulong)uVar8,0);
  AVar7 = WasmSignature::GetParamCount(this_02);
  this_00 = &this->m_alloc;
  count = (ulong)AVar7;
  if (AVar7 == 0) {
    local_48 = (EmitInfo *)&DAT_00000008;
  }
  else {
    BVar10 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar10 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar19 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar6) goto LAB_00f241f6;
      *puVar19 = 0;
    }
    local_48 = (EmitInfo *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal(&this_00->
                              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ,(ulong)((uint)AVar7 * 8));
    if (local_48 == (EmitInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar19 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar6) goto LAB_00f241f6;
      *puVar19 = 0;
    }
    pEVar26 = local_48;
    do {
      pEVar26->super_EmitInfoBase = 0xffffffff;
      pEVar26->type = Void;
      pEVar26 = pEVar26 + 1;
    } while (pEVar26 != local_48 + count);
    if (count != 0) {
      lVar28 = count + 1;
      do {
        LVar11 = WasmSignature::GetParam(this_02,(short)lVar28 - 2);
        EVar22 = PopEvalStack(this,LVar11,L"Call argument does not match formal type");
        local_48[lVar28 + -2] = EVar22;
        lVar28 = lVar28 + -1;
      } while (1 < lVar28);
      if (count != 0) {
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        local_98 = local_34 & 0xff ^ 0x145;
        bVar6 = (byte)local_34 != 0;
        local_94 = 0x21;
        if (bVar6) {
          local_94 = 0x15;
        }
        local_90 = 0x20;
        if (bVar6) {
          local_90 = 0x14;
        }
        local_8c = (uint)(byte)((byte)local_34 ^ 1) * 8 + 0x17;
        uVar25 = 0x22;
        if (bVar6) {
          uVar25 = 0x16;
        }
        retInfo.field_1.singleInfo.super_EmitInfoBase.location = (EmitInfoBase)(EmitInfoBase)uVar25;
        uVar32 = 1;
        uVar29 = 0;
LAB_00f23b71:
        WVar30 = local_48[uVar29].type;
        if (7 < WVar30 - FirstLocalType) {
switchD_00f23b9b_caseD_6:
          WasmTypes::
          CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
                    ();
          this_03 = (WasmCompilationException *)__cxa_allocate_exception(8);
          WasmCompilationException::WasmCompilationException
                    (this_03,L"Unknown argument type %u",(ulong)WVar30);
          goto LAB_00f241e0;
        }
        uVar13 = local_48[uVar29].super_EmitInfoBase.location;
        uVar31 = (ulong)retInfo.field_1.infos & 0xffffffff;
        switch(WVar30) {
        case FirstLocalType:
          uVar12 = local_90;
          break;
        case I64:
          uVar12 = local_94;
          break;
        case F32:
          goto switchD_00f23b9b_caseD_3;
        case F64:
          uVar12 = local_8c;
          break;
        case V128:
          Simd::EnsureSimdIsEnabled();
          uVar12 = local_98;
          break;
        default:
          goto switchD_00f23b9b_caseD_6;
        case Any:
          uVar31 = 0x14;
          if (this->isUnreachable != false) goto switchD_00f23b9b_caseD_3;
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar19 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                             ,0x4a6,"(IsUnreachable())","IsUnreachable()");
          if (!bVar6) goto LAB_00f241f6;
          *puVar19 = 0;
          if ((this->isUnreachable & 1U) == 0) goto switchD_00f23b9b_caseD_6;
          goto switchD_00f23b9b_caseD_3;
        }
        uVar31 = (ulong)uVar12;
switchD_00f23b9b_caseD_3:
        (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
                  (this->m_writer,uVar31 & 0xffff,uVar32,(ulong)uVar13);
        uVar13 = 1;
        if ((char)local_34 == '\0') {
          AVar9 = WasmSignature::GetParamSize(this_02,(ArgSlot)uVar29);
          if ((AVar9 & 7) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar19 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                               ,0x4bc,
                               "(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)))",
                               "Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var))");
            if (!bVar6) goto LAB_00f241f6;
            *puVar19 = 0;
          }
          uVar13 = (uint)(AVar9 >> 3);
        }
        uVar32 = (ulong)((int)uVar32 + uVar13);
        uVar29 = uVar29 + 1;
        if (count == uVar29) goto LAB_00f23ce1;
        goto LAB_00f23b71;
      }
    }
  }
LAB_00f23ce1:
  this_01 = &this->mTypedRegisterAllocator;
  pRVar23 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_01,INT64);
  RVar14 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar23);
  pRVar23 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_01,INT64);
  RVar15 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar23);
  pIVar3 = this->m_writer;
  TVar2 = this->m_module->m_importedFunctionCount;
  uVar16 = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module);
  (*pIVar3->_vptr_IWasmByteCodeWriter[0x18])
            (pIVar3,0x4d,(ulong)RVar15,1,(ulong)(TVar2 + uVar16 + 1));
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x18])
            (this->m_writer,0x58,(ulong)RVar14,(ulong)RVar15,EVar20);
  pRVar23 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_01,INT64);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar23,RVar15);
  pIVar3 = this->m_writer;
  uVar16 = WasmSignature::GetSignatureId(this_02);
  (*pIVar3->_vptr_IWasmByteCodeWriter[9])(pIVar3,0x59,(ulong)RVar14,(ulong)uVar16);
  local_88._0_4_ = 0;
  retInfo.count = 0;
  retInfo._4_4_ = 0;
  PolymorphicEmitInfo::Init((PolymorphicEmitInfo *)local_88,this_02->m_resultsCount,this_00);
  if (this_02->m_resultsCount != 0) {
    uVar16 = 0;
    do {
      LVar11 = WasmSignature::GetResult(this_02,uVar16);
      PolymorphicEmitInfo::SetInfo
                ((PolymorphicEmitInfo *)local_88,(EmitInfo)(((ulong)LVar11 << 0x20) + 0xffffffff),
                 uVar16);
      uVar16 = uVar16 + 1;
    } while (uVar16 < this_02->m_resultsCount);
  }
  if ((char)local_34 == '\0') {
    pRVar23 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_01,INT64);
    WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar23,RVar14);
    ReleaseLocation(this,&local_a0);
    if (count != 0) {
      uVar29 = (ulong)((uint)AVar7 * 8);
      do {
        ReleaseLocation(this,(EmitInfo *)((long)&local_48[-1].super_EmitInfoBase.location + uVar29))
        ;
        uVar29 = uVar29 - 8;
      } while (uVar29 != 0);
    }
    if (this_02->m_resultsCount != 0) {
      uVar16 = 0;
      do {
        LVar11 = WasmSignature::GetResult(this_02,uVar16);
        pWVar24 = GetRegisterSpace(this,LVar11);
        EVar17.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar24);
        EVar20.type = LVar11;
        EVar20.super_EmitInfoBase.location = EVar17.location;
        PolymorphicEmitInfo::SetInfo((PolymorphicEmitInfo *)local_88,EVar20,uVar16);
        uVar16 = uVar16 + 1;
      } while (uVar16 < this_02->m_resultsCount);
    }
    if (local_88._0_4_ == 0) {
      WVar30 = Void;
      EVar22.super_EmitInfoBase.location = 0xffffffff;
      EVar22.type = Void;
    }
    else {
      EVar22 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_88,0);
      WVar30 = EVar22.type;
    }
    pIVar3 = this->m_writer;
    local_38 = uVar8 >> 3;
    AVar18 = WasmToAsmJs::GetAsmJsReturnType(WVar30);
    (*pIVar3->_vptr_IWasmByteCodeWriter[0x20])
              (pIVar3,0x1d,(ulong)EVar22 & 0xffffffff,RVar14,(ulong)(uVar8 >> 3),
               (ulong)AVar18.which_,0xffff);
    goto LAB_00f24109;
  }
  local_38 = WasmSignature::GetParamCount(this_02);
  UInt16Math::Inc<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>()::_lambda()_1_const>
            (&local_38,&local_35);
  pRVar23 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_01,INT64);
  local_34 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar23);
  uVar13 = this_02->m_resultsCount;
  if (1 < uVar13) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar19 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x4e8,"(calleeSignature->GetResultCount() <= 1)",
                       "Multiple results from function imports not supported");
    if (!bVar6) goto LAB_00f241f6;
    *puVar19 = 0;
    uVar13 = this_02->m_resultsCount;
  }
  if (uVar13 == 0) {
    retInfo.field_1.infos = (EmitInfo *)0x0;
  }
  else {
    LVar11 = WasmSignature::GetResult(this_02,0);
    retInfo.field_1.singleInfo.type = 0;
    retInfo.field_1.singleInfo.super_EmitInfoBase.location = (EmitInfoBase)(EmitInfoBase)LVar11;
  }
  pIVar3 = this->m_writer;
  uVar29 = (ulong)local_38;
  AVar18 = WasmToAsmJs::GetAsmJsReturnType
                     (retInfo.field_1.singleInfo.super_EmitInfoBase.location.location);
  RVar15 = local_34;
  (*pIVar3->_vptr_IWasmByteCodeWriter[0x20])
            (pIVar3,0x12,(ulong)local_34,(ulong)RVar14,uVar29,(ulong)AVar18.which_,0xffff);
  pRVar23 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_01,INT64);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar23,RVar15);
  pRVar23 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_01,INT64);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar23,RVar14);
  ReleaseLocation(this,&local_a0);
  if (count != 0) {
    uVar29 = (ulong)((uint)AVar7 * 8);
    do {
      ReleaseLocation(this,(EmitInfo *)((long)&local_48[-1].super_EmitInfoBase.location + uVar29));
      uVar29 = uVar29 - 8;
    } while (uVar29 != 0);
  }
  aVar5 = retInfo.field_1;
  if (this_02->m_resultsCount == 0) goto LAB_00f24109;
  switch(retInfo.field_1.singleInfo.super_EmitInfoBase.location.location) {
  case 1:
    uVar27 = 0x18;
    break;
  case 2:
    uVar27 = 0x1b;
    break;
  case 3:
    uVar27 = 0x19;
    break;
  case 4:
    uVar27 = 0x1a;
    break;
  case 5:
    this_03 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_03,L"Return type: v128 not supported in import calls");
    goto LAB_00f241e0;
  default:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    this_03 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_03,L"Unknown call return type %u",(ulong)aVar5.infos & 0xffffffff);
LAB_00f241e0:
    __cxa_throw(this_03,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  pWVar24 = GetRegisterSpace(this,retInfo.field_1.singleInfo.super_EmitInfoBase.location.location);
  RVar14 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar24);
  PolymorphicEmitInfo::SetInfo
            ((PolymorphicEmitInfo *)local_88,(EmitInfo)((ulong)RVar14 | (long)aVar5.infos << 0x20),0
            );
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
            (this->m_writer,(ulong)uVar27,(ulong)RVar14,(ulong)local_34);
LAB_00f24109:
  Memory::DeleteArray<Memory::ArenaAllocator,Wasm::EmitInfo>(this_00,count,local_48);
  if (this->m_maxArgOutDepth <= (uint)local_38) {
    this->m_maxArgOutDepth = local_38 + 1;
  }
  PVar33._4_4_ = 0;
  PVar33.count = local_88._0_4_;
  PVar33.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)retInfo._0_8_;
  return PVar33;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitCall()
{
    uint32 funcNum = Js::Constants::UninitializedValue;
    uint32 signatureId = Js::Constants::UninitializedValue;
    WasmSignature* calleeSignature = nullptr;
    Js::ProfileId profileId = Js::Constants::NoProfileId;
    EmitInfo indirectIndexInfo;
    const bool isImportCall = GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Import;
    Assert(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk);
    switch (wasmOp)
    {
    case wbCall:
    {
        funcNum = GetReader()->m_currentNode.call.num;
        WasmFunctionInfo* calleeInfo = m_module->GetWasmFunctionInfo(funcNum);
        calleeSignature = calleeInfo->GetSignature();
        // currently only handle inlining internal function calls
        // in future we can expand to all calls by adding checks in inliner and falling back to call in case ScriptFunction doesn't match
        if (GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function && !PHASE_TRACE1(Js::WasmInOutPhase))
        {
            profileId = GetNextProfileId();
        }
        break;
    }
    case wbCallIndirect:
        indirectIndexInfo = PopEvalStack(WasmTypes::I32, _u("Indirect call index must be int type"));
        signatureId = GetReader()->m_currentNode.call.num;
        calleeSignature = m_module->GetSignature(signatureId);
        break;
    default:
        Assume(UNREACHED);
    }

    const auto argOverflow = []
    {
        throw WasmCompilationException(_u("Argument size too big"));
    };

    // emit start call
    Js::ArgSlot argSize;
    Js::OpCodeAsmJs startCallOp;
    if (isImportCall)
    {
        argSize = ArgSlotMath::Mul(calleeSignature->GetParamCount(), sizeof(Js::Var), argOverflow);
        startCallOp = Js::OpCodeAsmJs::StartCall;
    }
    else
    {
        startCallOp = Js::OpCodeAsmJs::I_StartCall;
        argSize = calleeSignature->GetParamsSize();
    }
    // Add return value
    argSize = ArgSlotMath::Add(argSize, sizeof(Js::Var), argOverflow);
    if (!Math::IsAligned<Js::ArgSlot>(argSize, sizeof(Js::Var)))
    {
        AssertMsg(UNREACHED, "Wasm argument size should always be Var aligned");
        throw WasmCompilationException(_u("Internal Error"));
    }

    m_writer->AsmStartCall(startCallOp, argSize);

    Js::ArgSlot nArgs = calleeSignature->GetParamCount();

    // copy args into a list so they could be generated in the right order (FIFO)
    EmitInfo* argsList = AnewArray(&m_alloc, EmitInfo, nArgs);
    for (int i = int(nArgs) - 1; i >= 0; --i)
    {
        EmitInfo info = PopEvalStack(calleeSignature->GetParam((Js::ArgSlot)i), _u("Call argument does not match formal type"));
        // We can release the location of the arguments now, because we won't create new temps between start/call
        argsList[i] = info;
    }

    // Skip the this pointer (aka undefined)
    uint32 argLoc = 1;
    for (Js::ArgSlot i = 0; i < nArgs; ++i)
    {
        EmitInfo info = argsList[i];

        Js::OpCodeAsmJs argOp = Js::OpCodeAsmJs::Nop;
        switch (info.type)
        {
        case WasmTypes::F32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Flt : Js::OpCodeAsmJs::I_ArgOut_Flt;
            break;
        case WasmTypes::F64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Db : Js::OpCodeAsmJs::I_ArgOut_Db;
            break;
        case WasmTypes::I32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Int : Js::OpCodeAsmJs::I_ArgOut_Int;
            break;
        case WasmTypes::I64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Long : Js::OpCodeAsmJs::I_ArgOut_Long;
            break;
#ifdef ENABLE_WASM_SIMD
        case WasmTypes::V128:
            Simd::EnsureSimdIsEnabled();
            argOp = isImportCall ? Js::OpCodeAsmJs::Simd128_ArgOut_F4 : Js::OpCodeAsmJs::Simd128_I_ArgOut_F4;
            break;
#endif
        case WasmTypes::Any:
            // In unreachable mode allow any type as argument since we won't actually emit the call
            Assert(IsUnreachable());
            if (IsUnreachable())
            {
                argOp = Js::OpCodeAsmJs::ArgOut_Int;
                break;
            }
            // Fall through
        default:
            WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
            throw WasmCompilationException(_u("Unknown argument type %u"), info.type);
        }

        m_writer->AsmReg2(argOp, argLoc, info.location);

        // Calculated next argument Js::Var location
        if (isImportCall)
        {
            ++argLoc;
        }
        else
        {
            const Js::ArgSlot currentArgSize = calleeSignature->GetParamSize(i);
            Assert(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)));
            argLoc += currentArgSize / sizeof(Js::Var);
        }
    }

    Js::RegSlot funcReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();

    // emit call
    switch (wasmOp)
    {
    case wbCall:
    {
        uint32 offset = isImportCall ? m_module->GetImportFuncOffset() : m_module->GetFuncOffset();
        uint32 index = UInt32Math::Add(offset, funcNum);
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlot, funcReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, index);
        break;
    }
    case wbCallIndirect:
    {
        Js::RegSlot slotReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlotArr, slotReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, m_module->GetTableEnvironmentOffset());
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdArr_WasmFunc, funcReg, slotReg, indirectIndexInfo.location);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(slotReg);
        m_writer->AsmReg1IntConst1(Js::OpCodeAsmJs::CheckSignature, funcReg, calleeSignature->GetSignatureId());
        break;
    }
    default:
        Assume(UNREACHED);
    }

    // calculate number of RegSlots(Js::Var) the call consumes
    PolymorphicEmitInfo retInfo;
    retInfo.Init(calleeSignature->GetResultCount(), &m_alloc);
    for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
    {
        retInfo.SetInfo(EmitInfo(calleeSignature->GetResult(i)), i);
    }
    Js::ArgSlot args;
    if (isImportCall)
    {
        args = calleeSignature->GetParamCount();
        ArgSlotMath::Inc(args, argOverflow);

        Js::RegSlot varRetReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        AssertOrFailFastMsg(calleeSignature->GetResultCount() <= 1, "Multiple results from function imports not supported");
        WasmTypes::WasmType singleResType = calleeSignature->GetResultCount() > 0 ? calleeSignature->GetResult(0) : WasmTypes::Void;
        m_writer->AsmCall(Js::OpCodeAsmJs::Call, varRetReg, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResType), profileId);

        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(varRetReg);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);

        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        // emit result coercion
        if (calleeSignature->GetResultCount() > 0)
        {
            Js::OpCodeAsmJs convertOp = Js::OpCodeAsmJs::Nop;
            switch (singleResType)
            {
            case WasmTypes::F32:
                convertOp = Js::OpCodeAsmJs::Conv_VTF;
                break;
            case WasmTypes::F64:
                convertOp = Js::OpCodeAsmJs::Conv_VTD;
                break;
            case WasmTypes::I32:
                convertOp = Js::OpCodeAsmJs::Conv_VTI;
                break;
            case WasmTypes::I64:
                convertOp = Js::OpCodeAsmJs::Conv_VTL;
                break;
#ifdef ENABLE_WASM_SIMD
            case WasmTypes::V128:
                throw WasmCompilationException(_u("Return type: v128 not supported in import calls"));
#endif
            default:
                WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
                throw WasmCompilationException(_u("Unknown call return type %u"), singleResType);
            }
            Js::RegSlot location = GetRegisterSpace(singleResType)->AcquireTmpRegister();
            retInfo.SetInfo(EmitInfo(location, singleResType), 0);
            m_writer->AsmReg2(convertOp, location, varRetReg);
        }
    }
    else
    {
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);
        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
        {
            EmitInfo info(calleeSignature->GetResult(i));
            info.location = GetRegisterSpace(info.type)->AcquireTmpRegister();
            retInfo.SetInfo(info, i);
        }

        EmitInfo singleResultInfo = retInfo.Count() > 0 ? retInfo.GetInfo(0) : EmitInfo(WasmTypes::Void);
        args = (Js::ArgSlot)(::ceil((double)(argSize / sizeof(Js::Var))));
        // todo:: add bytecode to call and set aside multi results
        m_writer->AsmCall(Js::OpCodeAsmJs::I_Call, singleResultInfo.location, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResultInfo.type), profileId);
    }
    AdeleteArray(&m_alloc, nArgs, argsList);

    // WebAssemblyArrayBuffer is not detachable, no need to check for detached state here

    // track stack requirements for out params

    // + 1 for return address
    uint32 maxDepthForLevel = args + 1;
    if (maxDepthForLevel > m_maxArgOutDepth)
    {
        m_maxArgOutDepth = maxDepthForLevel;
    }

    return retInfo;
}